

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O2

FT_Error FT_Outline_EmboldenXY(FT_Outline *outline,FT_Pos xstrength,FT_Pos ystrength)

{
  ushort uVar1;
  FT_Vector *pFVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FT_UInt32 FVar6;
  FT_Error FVar7;
  FT_Long FVar8;
  FT_Long FVar9;
  FT_Long FVar10;
  ulong a_;
  ulong uVar11;
  long lVar12;
  FT_Pos a__00;
  FT_Long FVar13;
  FT_Pos a__01;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  FT_Vector local_a8;
  long local_98;
  FT_Long local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  FT_Orientation local_70;
  int local_6c;
  ulong local_68;
  FT_Long local_60;
  FT_Long local_58;
  ulong local_50;
  FT_Outline *local_48;
  ulong local_40;
  ulong local_38;
  
  if (outline == (FT_Outline *)0x0) {
    return 0x14;
  }
  FVar7 = 0;
  if (2 < xstrength + 1U || 2 < ystrength + 1U) {
    local_70 = FT_Outline_Get_Orientation(outline);
    if (local_70 == FT_ORIENTATION_NONE) {
      FVar7 = 6;
      if (outline->n_contours == 0) {
        FVar7 = 0;
      }
    }
    else {
      pFVar2 = outline->points;
      uVar1 = outline->n_contours;
      if ((short)uVar1 < 1) {
        uVar1 = 0;
      }
      local_40 = (ulong)uVar1;
      iVar15 = 0;
      local_80 = ystrength / 2;
      local_78 = xstrength / 2;
      local_48 = outline;
      for (local_38 = 0; local_38 != local_40; local_38 = local_38 + 1) {
        iVar14 = (int)local_48->contours[local_38];
        local_58 = 0;
        local_60 = 0;
        a_ = 0;
        local_68 = 0;
        iVar16 = -1;
        FVar10 = 0;
        FVar13 = 0;
        iVar18 = iVar14;
        iVar4 = iVar15;
        while ((iVar4 != iVar18 && (iVar18 != iVar16))) {
          if (iVar4 == iVar16) {
            local_a8.x = local_60;
            local_a8.y = local_58;
            uVar11 = local_68;
LAB_001dd486:
            a__00 = local_a8.x;
            a__01 = local_a8.y;
            iVar5 = iVar4;
            if (a_ != 0) {
              local_6c = iVar16;
              if (iVar16 < 0) {
                local_6c = iVar18;
                local_68 = a_;
                local_60 = FVar10;
                local_58 = FVar13;
              }
              local_50 = uVar11;
              FVar8 = FT_MulFix(FVar10,local_a8.x);
              a__01 = local_a8.y;
              FVar9 = FT_MulFix(FVar13,local_a8.y);
              if (FVar9 + FVar8 < -0xefff) {
                lVar12 = 0;
                FVar10 = 0;
              }
              else {
                local_88 = FVar9 + FVar8 + 0x10000;
                local_90 = a__01 + FVar13;
                local_98 = a__00 + FVar10;
                FVar8 = -local_90;
                lVar17 = -local_98;
                FVar9 = FT_MulFix(a__00,FVar13);
                FVar10 = FT_MulFix(a__01,FVar10);
                lVar12 = -(FVar9 - FVar10);
                FVar13 = local_98;
                if (local_70 != FT_ORIENTATION_FILL_RIGHT) {
                  lVar12 = FVar9 - FVar10;
                  FVar13 = lVar17;
                  FVar8 = local_90;
                }
                if ((long)local_50 <= (long)a_) {
                  a_ = local_50;
                }
                local_98 = FT_MulFix(local_78,lVar12);
                local_90 = FT_MulFix(a_,local_88);
                FVar10 = local_88;
                uVar11 = local_78;
                if (local_90 < local_98) {
                  FVar10 = lVar12;
                  uVar11 = a_;
                }
                FVar10 = FT_MulDiv(FVar8,uVar11,FVar10);
                FVar9 = FT_MulFix(local_80,lVar12);
                FVar8 = local_88;
                uVar11 = local_80;
                if (local_90 < FVar9) {
                  FVar8 = lVar12;
                  uVar11 = a_;
                }
                lVar12 = FT_MulDiv(FVar13,uVar11,FVar8);
              }
              while (uVar11 = local_50, iVar16 = local_6c, iVar18 != iVar4) {
                pFVar2[iVar18].x = pFVar2[iVar18].x + FVar10 + local_78;
                pFVar2[iVar18].y = pFVar2[iVar18].y + lVar12 + local_80;
                bVar3 = iVar14 <= iVar18;
                iVar18 = iVar18 + 1;
                if (bVar3) {
                  iVar18 = iVar15;
                }
              }
            }
          }
          else {
            local_a8.x = pFVar2[iVar4].x - pFVar2[iVar18].x;
            local_a8.y = pFVar2[iVar4].y - pFVar2[iVar18].y;
            FVar6 = FT_Vector_NormLen(&local_a8);
            uVar11 = a_;
            a__00 = FVar10;
            a__01 = FVar13;
            iVar5 = iVar18;
            if (FVar6 != 0) {
              uVar11 = (ulong)FVar6;
              goto LAB_001dd486;
            }
          }
          iVar18 = iVar5;
          a_ = uVar11;
          bVar3 = iVar14 <= iVar4;
          FVar10 = a__00;
          FVar13 = a__01;
          iVar4 = iVar4 + 1;
          if (bVar3) {
            iVar4 = iVar15;
          }
        }
        iVar15 = iVar14 + 1;
      }
      FVar7 = 0;
    }
  }
  return FVar7;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_EmboldenXY( FT_Outline*  outline,
                         FT_Pos       xstrength,
                         FT_Pos       ystrength )
  {
    FT_Vector*      points;
    FT_Int          c, first, last;
    FT_Orientation  orientation;


    if ( !outline )
      return FT_THROW( Invalid_Outline );

    xstrength /= 2;
    ystrength /= 2;
    if ( xstrength == 0 && ystrength == 0 )
      return FT_Err_Ok;

    orientation = FT_Outline_Get_Orientation( outline );
    if ( orientation == FT_ORIENTATION_NONE )
    {
      if ( outline->n_contours )
        return FT_THROW( Invalid_Argument );
      else
        return FT_Err_Ok;
    }

    points = outline->points;

    first = 0;
    for ( c = 0; c < outline->n_contours; c++ )
    {
      FT_Vector  in, out, anchor, shift;
      FT_Fixed   l_in, l_out, l_anchor = 0, l, q, d;
      FT_Int     i, j, k;


      l_in = 0;
      last = outline->contours[c];

      /* pacify compiler */
      in.x = in.y = anchor.x = anchor.y = 0;

      /* Counter j cycles though the points; counter i advances only  */
      /* when points are moved; anchor k marks the first moved point. */
      for ( i = last, j = first, k = -1;
            j != i && i != k;
            j = j < last ? j + 1 : first )
      {
        if ( j != k )
        {
          out.x = points[j].x - points[i].x;
          out.y = points[j].y - points[i].y;
          l_out = (FT_Fixed)FT_Vector_NormLen( &out );

          if ( l_out == 0 )
            continue;
        }
        else
        {
          out   = anchor;
          l_out = l_anchor;
        }

        if ( l_in != 0 )
        {
          if ( k < 0 )
          {
            k        = i;
            anchor   = in;
            l_anchor = l_in;
          }

          d = FT_MulFix( in.x, out.x ) + FT_MulFix( in.y, out.y );

          /* shift only if turn is less than ~160 degrees */
          if ( d > -0xF000L )
          {
            d = d + 0x10000L;

            /* shift components along lateral bisector in proper orientation */
            shift.x = in.y + out.y;
            shift.y = in.x + out.x;

            if ( orientation == FT_ORIENTATION_TRUETYPE )
              shift.x = -shift.x;
            else
              shift.y = -shift.y;

            /* restrict shift magnitude to better handle collapsing segments */
            q = FT_MulFix( out.x, in.y ) - FT_MulFix( out.y, in.x );
            if ( orientation == FT_ORIENTATION_TRUETYPE )
              q = -q;

            l = FT_MIN( l_in, l_out );

            /* non-strict inequalities avoid divide-by-zero when q == l == 0 */
            if ( FT_MulFix( xstrength, q ) <= FT_MulFix( l, d ) )
              shift.x = FT_MulDiv( shift.x, xstrength, d );
            else
              shift.x = FT_MulDiv( shift.x, l, q );


            if ( FT_MulFix( ystrength, q ) <= FT_MulFix( l, d ) )
              shift.y = FT_MulDiv( shift.y, ystrength, d );
            else
              shift.y = FT_MulDiv( shift.y, l, q );
          }
          else
            shift.x = shift.y = 0;

          for ( ;
                i != j;
                i = i < last ? i + 1 : first )
          {
            points[i].x += xstrength + shift.x;
            points[i].y += ystrength + shift.y;
          }
        }
        else
          i = j;

        in   = out;
        l_in = l_out;
      }

      first = last + 1;
    }

    return FT_Err_Ok;
  }